

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_per_ema.c
# Opt level: O1

ErrorNumber test_func_per_ema(TA_History *history)

{
  TA_RetCode TVar1;
  ErrorNumber EVar2;
  ulong uVar3;
  ulong uVar4;
  TA_Test_conflict9 *pTVar5;
  TA_Integer outNbElement;
  TA_Integer outBegIdx;
  TA_Test_conflict9 *local_40;
  TA_Real *local_38;
  
  TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
  pTVar5 = tableTest;
  uVar4 = 0;
  do {
    if ((int)history->nbBars < pTVar5->expectedNbElement) {
      printf("TA_MA Failed Bad Parameter for Test #%d (%d,%d)\n",uVar4 & 0xffffffff);
      return TA_TESTUTIL_TFRR_BAD_PARAM;
    }
    clearAllBuffers();
    setInputBuffer(0,history->close,history->nbBars);
    setInputBuffer(1,history->close,history->nbBars);
    TVar1 = TA_SetUnstablePeriod(TA_FUNC_UNST_EMA,pTVar5->unstablePeriod);
    uVar3 = 0x8a;
    if (TVar1 == TA_SUCCESS) {
      TVar1 = TA_SUCCESS;
      if (pTVar5->theFunction == TA_ANY_MA_TEST) {
        TVar1 = TA_TRIX(pTVar5->startIdx,pTVar5->endIdx,gBuffer[0].in,pTVar5->optInTimePeriod,
                        &outBegIdx,&outNbElement,gBuffer[0].out0);
      }
      EVar2 = checkDataSame(gBuffer[0].in,history->close,history->nbBars);
      if ((EVar2 == TA_TEST_PASS) &&
         (EVar2 = checkExpectedValue(gBuffer[0].out0,TVar1,pTVar5->expectedRetCode,outBegIdx,
                                     pTVar5->expectedBegIdx,outNbElement,pTVar5->expectedNbElement,
                                     pTVar5->oneOfTheExpectedOutReal,
                                     pTVar5->oneOfTheExpectedOutRealIndex), EVar2 == TA_TEST_PASS))
      {
        outNbElement = 0;
        outBegIdx = 0;
        if (pTVar5->theFunction == TA_ANY_MA_TEST) {
          TVar1 = TA_TRIX(pTVar5->startIdx,pTVar5->endIdx,gBuffer[1].in,pTVar5->optInTimePeriod,
                          &outBegIdx,&outNbElement,gBuffer[1].in);
        }
        EVar2 = checkSameContent(gBuffer[0].out0,gBuffer[1].in);
        if (((EVar2 == TA_TEST_PASS) &&
            (EVar2 = checkExpectedValue(gBuffer[1].in,TVar1,pTVar5->expectedRetCode,outBegIdx,
                                        pTVar5->expectedBegIdx,outNbElement,
                                        pTVar5->expectedNbElement,pTVar5->oneOfTheExpectedOutReal,
                                        pTVar5->oneOfTheExpectedOutRealIndex), EVar2 == TA_TEST_PASS
            )) && ((local_38 = history->close, local_40 = pTVar5, pTVar5->doRangeTestFlag == 0 ||
                   (EVar2 = doRangeTest(rangeTestFunction,TA_FUNC_UNST_EMA,&local_40,1,0),
                   EVar2 == TA_TEST_PASS)))) {
          uVar3 = 0;
          goto LAB_001185e5;
        }
      }
      uVar3 = (ulong)EVar2;
    }
LAB_001185e5:
    if ((ErrorNumber)uVar3 != TA_TEST_PASS) {
      printf("TA_MA Failed Test #%d (Code=%d)\n",uVar4 & 0xffffffff,uVar3);
      return (ErrorNumber)uVar3;
    }
    uVar4 = uVar4 + 1;
    pTVar5 = pTVar5 + 1;
    if (uVar4 == 4) {
      TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
      return TA_TEST_PASS;
    }
  } while( true );
}

Assistant:

ErrorNumber test_func_per_ema( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   for( i=0; i < NB_TEST; i++ )
   {
      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "TA_MA Failed Bad Parameter for Test #%d (%d,%d)\n",
                 i, tableTest[i].expectedNbElement, history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test_per_ema( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "TA_MA Failed Test #%d (Code=%d)\n", i, retValue );
         return retValue;
      }
   }

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   /* All test succeed. */
   return TA_TEST_PASS;
}